

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbift3.cpp
# Opt level: O3

void CVmBifT3::get_named_arg(uint argc)

{
  ushort uVar1;
  bool bVar2;
  vm_val_t *val;
  int iVar3;
  ushort *puVar4;
  ushort *puVar5;
  int iVar6;
  ushort *puVar7;
  vm_val_t *fp;
  vm_val_t *argp;
  vm_val_t *local_38;
  
  CVmBif::check_argc_range(argc,1,2);
  puVar4 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
  if (puVar4 == (ushort *)0x0) {
    err_throw(0x7e3);
  }
  uVar1 = *puVar4;
  fp = frame_ptr_;
  do {
    if (fp == (vm_val_t *)0x0) {
      if (1 < argc) {
        CVmBif::retval(sp_ + -2);
        sp_ = sp_ + -(long)(int)argc;
        return;
      }
      err_throw_a(0x89c,1,4,puVar4 + 1,(ulong)uVar1);
    }
    puVar5 = (ushort *)CVmRun::get_named_args_from_frame(fp,&local_38);
    if (puVar5 != (ushort *)0x0) {
      puVar7 = puVar5 + 2;
      iVar6 = *puVar5 + 1;
      do {
        val = local_38;
        if (((uint)*puVar7 - (uint)puVar7[-1] == (uint)uVar1) &&
           (iVar3 = bcmp(puVar4 + 1,(void *)((long)puVar5 + (ulong)puVar7[-1] + 2),(ulong)uVar1),
           iVar3 == 0)) {
          CVmBif::retval(val);
          sp_ = sp_ + -(long)(int)argc;
          return;
        }
        local_38 = val + 1;
        puVar7 = puVar7 + 1;
        iVar3 = iVar6 + -1;
        bVar2 = 0 < iVar6;
        iVar6 = iVar3;
      } while (iVar3 != 0 && bVar2);
    }
    fp = (vm_val_t *)fp[-1].val.native_desc;
  } while( true );
}

Assistant:

void CVmBifT3::get_named_arg(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* get the name we're looking for */
    const char *name = G_stk->get(0)->get_as_string(vmg0_);
    if (name == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the length and buffer pointer */
    size_t namelen = vmb_get_len(name);
    name += VMB_LEN;

    /* 
     *   Scan the stack for named parameter tables.  A named parameter table
     *   is always in the calling frame at the stack slot just beyond the
     *   last argument.  
     */
    for (vm_val_t *fp = G_interpreter->get_frame_ptr() ; fp != 0 ;
         fp = G_interpreter->get_enclosing_frame_ptr(vmg_ fp))
    {
        /* check for a table in this frame */
        vm_val_t *argp;
        const uchar *t = CVmRun::get_named_args_from_frame(vmg_ fp, &argp);
        if (t != 0)
        {
            /* get the number of table entries */
            int n = osrp2(t);
            t += 2;

            /* scan the table for the name */
            for (int i = 0 ; n >= 0 ; --n, i += 2, ++argp)
            {
                /* get this element's offset, and figure its length */
                uint eofs = osrp2(t + i);
                uint elen = osrp2(t + i + 2) - eofs;

                /* check for a match */
                if (elen == namelen && memcmp(name, t + eofs, elen) == 0)
                {
                    /* found it - return the value */
                    retval(vmg_ argp);

                    /* discard arguments and return */
                    G_stk->discard(argc);
                    return;
                }
            }
        }
    }

    /* 
     *   The argument is undefined.  If a default value was supplied, simply
     *   return the default value.  Otherwise throw an error.  
     */
    if (argc >= 2)
    {
        /* a default value was supplied - simply return it */
        retval(vmg_ G_stk->get(1));

        /* discard arguments */
        G_stk->discard(argc);
    }
    else
    {
        /* no default value - throw an error */
        err_throw_a(VMERR_MISSING_NAMED_ARG, 1, ERR_TYPE_TEXTCHAR_LEN,
                    name, namelen);
    }
}